

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void process_player_input(tgestate_t *state)

{
  byte bVar1;
  input_t input;
  int new_byte;
  int offset;
  room_t room_index;
  uint8_t *puVar2;
  
  if (state->in_solitary != '\0') {
    return;
  }
  if (state->morale_exhausted != '\0') {
    return;
  }
  bVar1 = state->vischars[0].flags;
  if ((bVar1 & 3) != 0) {
    state->automatic_player_counter = '\x1f';
    if (bVar1 != 1) {
      cutting_wire(state);
      return;
    }
    picking_lock(state);
    return;
  }
  input = input_routine(state);
  if (input == 0) {
    if (state->automatic_player_counter == '\0') {
      return;
    }
    state->automatic_player_counter = state->automatic_player_counter + 0xff;
    input = 0;
    goto LAB_00106d93;
  }
  state->automatic_player_counter = '\x1f';
  if (state->hero_in_bed == '\0') {
    if (state->hero_in_breakfast != '\0') {
      puVar2 = &state->hero_in_breakfast;
      state->vischars[0].route.index = '+';
      state->vischars[0].route.step = '\0';
      state->vischars[0].mi.mappos.u = 0x34;
      state->vischars[0].mi.mappos.v = 0x3e;
      room_index = '\x19';
      offset = 0x26;
      new_byte = 0xd;
      goto LAB_00106d66;
    }
  }
  else {
    puVar2 = &state->hero_in_bed;
    state->vischars[0].route.index = ',';
    state->vischars[0].route.step = '\x01';
    state->vischars[0].target.u = '.';
    state->vischars[0].target.v = '.';
    state->vischars[0].mi.mappos.u = 0x2e;
    state->vischars[0].mi.mappos.v = 0x2e;
    state->vischars[0].mi.mappos.w = 0x18;
    room_index = '\x02';
    offset = 0x1a;
    new_byte = 9;
LAB_00106d66:
    set_roomdef(state,room_index,offset,new_byte);
    *puVar2 = '\0';
    setup_room(state);
    plot_interior_tiles(state);
  }
  if (8 < input) {
    process_player_input_fire(state,input);
    input = 0x80;
  }
LAB_00106d93:
  if (input != state->vischars[0].input) {
    state->vischars[0].input = (byte)input | 0x80;
  }
  return;
}

Assistant:

void process_player_input(tgestate_t *state)
{
  input_t input; /* was A */

  assert(state != NULL);

  if (state->in_solitary || state->morale_exhausted)
    return; /* Don't allow input. */

  if (state->vischars[0].flags & (vischar_FLAGS_PICKING_LOCK | vischar_FLAGS_CUTTING_WIRE))
  {
    /* Hero is picking a lock, or cutting through a wire fence. */

    /* Postpone automatic control for 31 turns. */
    state->automatic_player_counter = 31;

    if (state->vischars[0].flags == vischar_FLAGS_PICKING_LOCK)
      picking_lock(state);
    else
      cutting_wire(state);

    return;
  }

  input = input_routine(state);
  if (input == input_NONE)
  {
    /* No input */

    if (state->automatic_player_counter == 0)
      return;

    /* No player input: count down. */
    state->automatic_player_counter--;
    input = input_NONE;
  }
  else
  {
    /* Input received */

    /* Postpone automatic control for 31 turns. */
    state->automatic_player_counter = 31;

    if (state->hero_in_bed || state->hero_in_breakfast)
    {
//      printf("hero at breakfast %d\n", state->hero_in_breakfast);
//      printf("hero in bed %d\n", state->hero_in_bed);

      assert(state->hero_in_bed == 0 || state->hero_in_breakfast == 0);

      if (state->hero_in_bed == 0)
      {
        /* Hero was at breakfast. */
        state->vischars[0].route.index = routeindex_43_7833;
        state->vischars[0].route.step  = 0;
        state->vischars[0].mi.mappos.u = 52;
        state->vischars[0].mi.mappos.v = 62;
        set_roomdef(state,
                    room_25_MESS_HALL,
                    roomdef_25_BENCH_G,
                    interiorobject_EMPTY_BENCH);
        state->hero_in_breakfast = 0;
      }
      else
      {
        /* Hero was in bed. */
        state->vischars[0].route.index = routeindex_44_HUT2_RIGHT_TO_LEFT;
        state->vischars[0].route.step  = 1;
        state->vischars[0].target.u    = 46;
        state->vischars[0].target.v    = 46;
        state->vischars[0].mi.mappos.u = 46;
        state->vischars[0].mi.mappos.v = 46;
        state->vischars[0].mi.mappos.w = 24;
        set_roomdef(state,
                    room_2_HUT2LEFT,
                    roomdef_2_BED,
                    interiorobject_EMPTY_BED_FACING_SE);
        state->hero_in_bed = 0;
      }

      // FUTURE: replace with call to setup_room_and_plot
      setup_room(state);
      plot_interior_tiles(state);
    }

    if (input >= input_FIRE)
    {
      process_player_input_fire(state, input);
      input = input_KICK;
    }
  }

  /* If input state has changed then kick a sprite update. */
  if (state->vischars[0].input != input)
    state->vischars[0].input = input | input_KICK;
}